

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

bool __thiscall
Js::ByteCodeWriter::DoDynamicProfileOpcode(ByteCodeWriter *this,Phase tag,bool noHeuristics)

{
  bool bVar1;
  uint uVar2;
  LocalFunctionId LVar3;
  byte local_31;
  byte local_29;
  bool noHeuristics_local;
  Phase tag_local;
  ByteCodeWriter *this_local;
  
  bVar1 = DynamicProfileInfo::IsEnabled(tag,this->m_functionWrite);
  if (bVar1) {
    if (tag == InlinePhase) {
      uVar2 = FunctionProxy::GetSourceContextId((FunctionProxy *)this->m_functionWrite);
      LVar3 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->m_functionWrite);
      bVar1 = Phases::IsEnabled((Phases *)&DAT_01ea41a0,InlinePhase,uVar2,LVar3);
      local_29 = 1;
      if (!bVar1) {
        local_31 = 1;
        if (((!noHeuristics) && (local_31 = 1, (this->m_hasLoop & 1U) != 0)) &&
           (local_31 = 1, this->m_loopNest == 0)) {
          uVar2 = FunctionProxy::GetSourceContextId((FunctionProxy *)this->m_functionWrite);
          LVar3 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->m_functionWrite);
          bVar1 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,InlineOutsideLoopsPhase,uVar2,LVar3);
          local_31 = bVar1 ^ 0xff;
        }
        local_29 = local_31;
      }
      this_local._7_1_ = (bool)(local_29 & 1);
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ByteCodeWriter::DoDynamicProfileOpcode(Phase tag, bool noHeuristics) const
    {
#if ENABLE_PROFILE_INFO
        if (!DynamicProfileInfo::IsEnabled(tag, this->m_functionWrite))
        {
            return false;
        }

        // Other heuristics
        switch (tag)
        {
        case Phase::InlinePhase:
            // Do profile opcode everywhere if we are an inline candidate
            // Otherwise, only in loops if the function has loop
#pragma prefast(suppress:6236, "DevDiv bug 830883. False positive when PHASE_OFF is #defined as '(false)'.")
            return PHASE_FORCE(Phase::InlinePhase, this->m_functionWrite) ||
                ((noHeuristics || !this->m_hasLoop || (this->m_loopNest != 0) ||
                        !(PHASE_OFF(InlineOutsideLoopsPhase, this->m_functionWrite))));

        default:
            return true;
        }
#else
        return false;
#endif
    }